

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::interval_t,long,duckdb::UnaryOperatorWrapper,duckdb::DatePart::EpochMillisOperator>
               (interval_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar2;
  undefined8 uVar3;
  int64_t iVar4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  long lVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  interval_t *piVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  interval_t *local_70;
  interval_t local_68;
  ValidityMask *local_58;
  ulong local_50;
  idx_t local_48;
  long *local_40;
  idx_t local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_58 = mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar7 = 0;
      local_70 = ldata;
      do {
        local_68.months = local_70->months;
        local_68.days = local_70->days;
        local_68.micros = local_70->micros;
        lVar6 = duckdb::Interval::GetMilli(&local_68);
        result_data[iVar7] = lVar6;
        iVar7 = iVar7 + 1;
        local_70 = local_70 + 1;
      } while (count != iVar7);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_68,(unsigned_long **)mask,&local_38);
      iVar4 = local_68.micros;
      uVar3 = local_68._0_8_;
      local_68.months = 0;
      local_68.days = 0;
      local_68.micros = 0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar3;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar4;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.micros !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.micros);
      }
      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar5->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_50 = count + 0x3f >> 6;
      uVar12 = 0;
      uVar11 = 0;
      local_48 = count;
      do {
        puVar1 = (local_58->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar8 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar8 = count;
          }
LAB_0064cb16:
          uVar9 = uVar11;
          if (uVar11 < uVar8) {
            piVar10 = ldata + uVar11;
            do {
              local_68.months = piVar10->months;
              local_68.days = piVar10->days;
              local_68.micros = piVar10->micros;
              lVar6 = duckdb::Interval::GetMilli(&local_68);
              result_data[uVar11] = lVar6;
              uVar11 = uVar11 + 1;
              piVar10 = piVar10 + 1;
              uVar9 = uVar8;
            } while (uVar8 != uVar11);
          }
        }
        else {
          uVar2 = puVar1[uVar12];
          uVar8 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar8 = count;
          }
          uVar9 = uVar8;
          if (uVar2 != 0) {
            if (uVar2 == 0xffffffffffffffff) goto LAB_0064cb16;
            uVar9 = uVar11;
            if (uVar11 < uVar8) {
              local_40 = result_data + uVar11;
              piVar10 = ldata + uVar11;
              uVar13 = 0;
              do {
                if ((uVar2 >> (uVar13 & 0x3f) & 1) != 0) {
                  local_68.months = piVar10->months;
                  local_68.days = piVar10->days;
                  local_68.micros = piVar10->micros;
                  lVar6 = duckdb::Interval::GetMilli(&local_68);
                  local_40[uVar13] = lVar6;
                }
                uVar13 = uVar13 + 1;
                piVar10 = piVar10 + 1;
                uVar9 = uVar8;
                count = local_48;
              } while (uVar8 - uVar11 != uVar13);
            }
          }
        }
        uVar12 = uVar12 + 1;
        uVar11 = uVar9;
      } while (uVar12 != local_50);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}